

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O2

void __thiscall
Engine_testConstructWithHandlerVector_Test::TestBody
          (Engine_testConstructWithHandlerVector_Test *this)

{
  __uniq_ptr_impl<Handler,_std::default_delete<Handler>_> _Var1;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *pvVar2;
  char *pcVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertHelper local_78;
  AssertionResult gtest_ar;
  Engine e;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  handlers;
  
  handlers.
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  handlers.
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  handlers.
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::make_unique<PrintHandler>();
  e.prefix._M_dataplus._M_p = (pointer)gtest_ar._0_8_;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  std::
  vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
  ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
            ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
              *)&handlers,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&e);
  if (e.prefix._M_dataplus._M_p != (pointer)0x0) {
    (**(code **)(*(long *)e.prefix._M_dataplus._M_p + 0x18))();
  }
  e.prefix._M_dataplus._M_p = (pointer)0x0;
  if (gtest_ar._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar._0_8_ + 0x18))();
  }
  std::make_unique<TestHandler>();
  e.prefix._M_dataplus._M_p = (pointer)gtest_ar._0_8_;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  std::
  vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
  ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
            ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
              *)&handlers,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&e);
  if (e.prefix._M_dataplus._M_p != (pointer)0x0) {
    (**(code **)(*(long *)e.prefix._M_dataplus._M_p + 0x18))();
  }
  e.prefix._M_dataplus._M_p = (pointer)0x0;
  if (gtest_ar._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar._0_8_ + 0x18))();
  }
  Engine::Engine(&e,"foo",&handlers);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"foo\"","e.prefix",(char (*) [4])0x166245,&e.prefix);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0x21,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_78.data_._0_4_ = 2;
    pvVar2 = Engine::GetHandlers(&e);
    local_80.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)(pvVar2->
                super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar2->
                super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&gtest_ar,"2","e.GetHandlers().size()",(int *)&local_78,
               (unsigned_long *)&local_80);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_80);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x22,pcVar3);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
      pvVar2 = Engine::GetHandlers(&e);
      _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
      super__Head_base<0UL,_Handler_*,_false>._M_head_impl =
           (((pvVar2->
             super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<Handler,_std::default_delete<Handler>_>._M_t;
      if ((_Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>)
          _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
          super__Head_base<0UL,_Handler_*,_false>._M_head_impl == (Handler *)0x0) {
        local_78.data_ = (AssertHelperData *)0x0;
      }
      else {
        local_78.data_ =
             (AssertHelperData *)
             __dynamic_cast(_Var1._M_t.
                            super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
                            super__Head_base<0UL,_Handler_*,_false>._M_head_impl,&Handler::typeinfo,
                            &PrintHandler::typeinfo,0);
      }
      testing::internal::CmpHelperNE<decltype(nullptr),PrintHandler*>
                ((internal *)&gtest_ar,"nullptr",
                 "dynamic_cast<PrintHandler *>(e.GetHandlers()[0].get())",&local_80.ptr_,
                 (PrintHandler **)&local_78);
      if (gtest_ar.success_ != false) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_80.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        pvVar2 = Engine::GetHandlers(&e);
        _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
        super__Head_base<0UL,_Handler_*,_false>._M_head_impl =
             (pvVar2->
             super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
             super___uniq_ptr_impl<Handler,_std::default_delete<Handler>_>._M_t;
        if ((_Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>)
            _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
            super__Head_base<0UL,_Handler_*,_false>._M_head_impl == (Handler *)0x0) {
          local_78.data_ = (AssertHelperData *)0x0;
        }
        else {
          local_78.data_ =
               (AssertHelperData *)
               __dynamic_cast(_Var1._M_t.
                              super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
                              super__Head_base<0UL,_Handler_*,_false>._M_head_impl,
                              &Handler::typeinfo,&TestHandler::typeinfo,0);
        }
        testing::internal::CmpHelperNE<decltype(nullptr),TestHandler*>
                  ((internal *)&gtest_ar,"nullptr",
                   "dynamic_cast<TestHandler *>(e.GetHandlers()[1].get())",&local_80.ptr_,
                   (TestHandler **)&local_78);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_80);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                     ,0x24,pcVar3);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_80);
        }
        goto LAB_00111fdf;
      }
      testing::Message::Message((Message *)&local_80);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x23,pcVar3);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_78);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_80);
LAB_00111fdf:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Engine::~Engine(&e);
  std::
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ::~vector(&handlers);
  return;
}

Assistant:

TEST(Engine, testAddIntegerNoTags) {
    Engine e("test", std::make_unique<TestHandler>());
    e.Add("foo", 100000000);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.foo", im.name);
    ASSERT_EQ(MetricType::Counter, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100000000, im.value);
    ASSERT_EQ(0, im.tags.size());
}